

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  cmMakefile *pcVar1;
  bool bVar2;
  ulong uVar3;
  pointer ppVar4;
  PolicyID id;
  cmAlphaNum local_530;
  cmAlphaNum local_500;
  string local_4d0;
  cmAlphaNum local_4b0;
  cmAlphaNum local_480;
  undefined1 local_450 [8];
  string foundVar;
  undefined1 auStack_428 [7];
  bool result;
  cmAlphaNum local_418;
  cmAlphaNum local_3e8;
  undefined1 local_3b8 [8];
  string var;
  cmAlphaNum local_390;
  string local_360;
  cmAlphaNum local_340;
  string local_310;
  PolicyStatus local_2ec;
  iterator iStack_2e8;
  PolicyStatus status;
  _Self local_2e0;
  iterator it;
  cmAlphaNum local_2a8;
  string local_278;
  cmAlphaNum local_258;
  cmAlphaNum local_228;
  string local_1f8;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a8;
  string local_178;
  undefined1 local_158 [8];
  string mfile;
  cmAlphaNum local_f8;
  undefined1 local_c8 [8];
  string debugBuffer;
  undefined1 local_a0 [7];
  bool system;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string moduleFileName;
  bool *found_local;
  cmFindPackageCommand *this_local;
  
  moduleFileName.field_2._8_8_ = found;
  cmAlphaNum::cmAlphaNum(&local_70,"Find");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_a0,&this->Name);
  cmStrCat<char[7]>((string *)local_40,&local_70,(cmAlphaNum *)local_a0,(char (*) [7])0xc1f563);
  debugBuffer.field_2._M_local_buf[0xf] = '\0';
  cmAlphaNum::cmAlphaNum(&local_f8,"find_package considered the following paths for ");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&mfile.field_2 + 8),(string *)local_40);
  cmStrCat<char[3]>((string *)local_c8,&local_f8,(cmAlphaNum *)((long)&mfile.field_2 + 8),
                    (char (*) [3])0xc1c661);
  cmMakefile::GetModulesFile
            ((string *)local_158,(this->super_cmFindCommon).Makefile,(string *)local_40,
             (bool *)(debugBuffer.field_2._M_local_buf + 0xf),
             (bool)((this->super_cmFindCommon).DebugMode & 1),(string *)local_c8);
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_228,(string *)local_c8);
      cmAlphaNum::cmAlphaNum(&local_258,"The file was found at\n  ");
      cmStrCat<std::__cxx11::string,char[2]>
                (&local_1f8,&local_228,&local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 (char (*) [2])0xc47774);
      std::__cxx11::string::operator=((string *)local_c8,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_1a8,(string *)local_c8);
      cmAlphaNum::cmAlphaNum(&local_1d8,"The file was not found.\n");
      cmStrCat<>(&local_178,&local_1a8,&local_1d8);
      std::__cxx11::string::operator=((string *)local_c8,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
    cmAlphaNum::cmAlphaNum(&local_2a8,&this->DebugBuffer);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&it,(string *)local_c8);
    cmStrCat<>(&local_278,&local_2a8,(cmAlphaNum *)&it);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    if ((debugBuffer.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_2e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
           ::find(&this->DeprecatedFindModules,&this->Name);
      iStack_2e8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                   ::end(&this->DeprecatedFindModules);
      bVar2 = std::operator!=(&local_2e0,&stack0xfffffffffffffd18);
      if (bVar2) {
        pcVar1 = (this->super_cmFindCommon).Makefile;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                 ::operator->(&local_2e0);
        local_2ec = cmMakefile::GetPolicyStatus(pcVar1,ppVar4->second,false);
        if (local_2ec != OLD) {
          if (local_2ec == WARN) {
            pcVar1 = (this->super_cmFindCommon).Makefile;
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                     ::operator->(&local_2e0);
            cmPolicies::GetPolicyWarning_abi_cxx11_
                      (&local_360,(cmPolicies *)(ulong)ppVar4->second,id);
            cmAlphaNum::cmAlphaNum(&local_340,&local_360);
            cmAlphaNum::cmAlphaNum(&local_390,"\n");
            cmStrCat<>(&local_310,&local_340,&local_390);
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_310);
            std::__cxx11::string::~string((string *)&local_310);
            std::__cxx11::string::~string((string *)&local_360);
          }
          else if (local_2ec - NEW < 3) {
            this_local._7_1_ = true;
            var.field_2._12_4_ = 1;
            goto LAB_003e2fa2;
          }
        }
      }
    }
    *(undefined1 *)moduleFileName.field_2._8_8_ = 1;
    cmAlphaNum::cmAlphaNum(&local_3e8,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_418,"_FIND_MODULE");
    cmStrCat<>((string *)local_3b8,&local_3e8,&local_418);
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_428,"1");
    cmMakefile::AddDefinition(pcVar1,(string *)local_3b8,_auStack_428);
    foundVar.field_2._M_local_buf[0xf] = ReadListFile(this,(string *)local_158,DoPolicyScope);
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,(string *)local_3b8);
    if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
      cmAlphaNum::cmAlphaNum(&local_480,&this->Name);
      cmAlphaNum::cmAlphaNum(&local_4b0,"_FOUND");
      cmStrCat<>((string *)local_450,&local_480,&local_4b0);
      bVar2 = cmMakefile::IsDefinitionSet((this->super_cmFindCommon).Makefile,(string *)local_450);
      if ((bVar2) &&
         (bVar2 = cmMakefile::IsOn((this->super_cmFindCommon).Makefile,(string *)local_450), !bVar2)
         ) {
        cmAlphaNum::cmAlphaNum(&local_500,&this->DebugBuffer);
        cmAlphaNum::cmAlphaNum(&local_530,"The module is considered not found due to ");
        cmStrCat<std::__cxx11::string,char[14]>
                  (&local_4d0,&local_500,&local_530,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450,
                   (char (*) [14])" being FALSE.");
        std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
      }
      std::__cxx11::string::~string((string *)local_450);
    }
    this_local._7_1_ = (bool)(foundVar.field_2._M_local_buf[0xf] & 1);
    var.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_3b8);
  }
  else {
    this_local._7_1_ = true;
    var.field_2._12_4_ = 1;
  }
LAB_003e2fa2:
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string moduleFileName = cmStrCat("Find", this->Name, ".cmake");

  bool system = false;
  std::string debugBuffer = cmStrCat(
    "find_package considered the following paths for ", moduleFileName, ":\n");
  std::string mfile = this->Makefile->GetModulesFile(
    moduleFileName, system, this->DebugMode, debugBuffer);
  if (this->DebugMode) {
    if (mfile.empty()) {
      debugBuffer = cmStrCat(debugBuffer, "The file was not found.\n");
    } else {
      debugBuffer =
        cmStrCat(debugBuffer, "The file was found at\n  ", mfile, "\n");
    }
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }

  if (!mfile.empty()) {
    if (system) {
      auto const it = this->DeprecatedFindModules.find(this->Name);
      if (it != this->DeprecatedFindModules.end()) {
        cmPolicies::PolicyStatus status =
          this->Makefile->GetPolicyStatus(it->second);
        switch (status) {
          case cmPolicies::WARN: {
            this->Makefile->IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(it->second), "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            return true;
        }
      }
    }

    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string const var = cmStrCat(this->Name, "_FIND_MODULE");
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile, DoPolicyScope);
    this->Makefile->RemoveDefinition(var);

    if (this->DebugMode) {
      std::string const foundVar = cmStrCat(this->Name, "_FOUND");
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {

        this->DebugBuffer = cmStrCat(
          this->DebugBuffer, "The module is considered not found due to ",
          foundVar, " being FALSE.");
      }
    }
    return result;
  }
  return true;
}